

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O1

RuleBasedBreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::refreshInputText
          (RuleBasedBreakIterator *this,UText *input,UErrorCode *status)

{
  UText *ut;
  int64_t index;
  int64_t iVar1;
  
  if (U_ZERO_ERROR < *status) {
    return this;
  }
  if (input != (UText *)0x0) {
    ut = &this->fText;
    index = utext_getNativeIndex_63(ut);
    utext_clone_63(ut,input,'\0','\x01',status);
    if (U_ZERO_ERROR < *status) {
      return this;
    }
    utext_setNativeIndex_63(ut,index);
    iVar1 = utext_getNativeIndex_63(ut);
    if (iVar1 == index) {
      return this;
    }
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return this;
}

Assistant:

RuleBasedBreakIterator &RuleBasedBreakIterator::refreshInputText(UText *input, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    if (input == NULL) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    int64_t pos = utext_getNativeIndex(&fText);
    //  Shallow read-only clone of the new UText into the existing input UText
    utext_clone(&fText, input, FALSE, TRUE, &status);
    if (U_FAILURE(status)) {
        return *this;
    }
    utext_setNativeIndex(&fText, pos);
    if (utext_getNativeIndex(&fText) != pos) {
        // Sanity check.  The new input utext is supposed to have the exact same
        // contents as the old.  If we can't set to the same position, it doesn't.
        // The contents underlying the old utext might be invalid at this point,
        // so it's not safe to check directly.
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}